

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_GetMethodPropertyScoped<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this_00;
  bool bVar2;
  PropertyId propertyId;
  Var aValue_00;
  RecyclableObject *object;
  InlineCache *inlineCache;
  undefined1 local_80 [8];
  PropertyValueInfo info;
  Var aValue;
  
  this_00 = *(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8);
  IVar1 = this_00->implicitCallFlags;
  ThreadContext::ClearImplicitCallFlags(this_00);
  aValue_00 = GetReg<unsigned_short>(this,playout->Instance);
  propertyId = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  bVar2 = VarIs<Js::RecyclableObject>(aValue_00);
  if (bVar2) {
    object = VarTo<Js::RecyclableObject>(aValue_00);
  }
  else {
    object = (RecyclableObject *)0x0;
  }
  inlineCache = GetInlineCache(this,(uint)playout->inlineCacheIndex);
  local_80 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_80,*(FunctionBody **)(this + 0x88),inlineCache,
             (uint)playout->inlineCacheIndex,true);
  if ((object != (RecyclableObject *)0x0) &&
     (bVar2 = CacheOperators::
              TryGetProperty<true,true,false,false,false,false,true,false,false,false>
                        (object,false,object,propertyId,(Var *)&info.inlineCacheIndex,
                         *(ScriptContext **)(this + 0x78),(PropertyCacheOperationInfo *)0x0,
                         (PropertyValueInfo *)local_80), bVar2)) {
    ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
    this_00->implicitCallFlags = this_00->implicitCallFlags | IVar1;
    SetReg<unsigned_short>(this,playout->Value,(Var)info._56_8_);
    return;
  }
  OP_GetMethodPropertyScoped_NoFastPath<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
            (this,playout);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
  this_00->implicitCallFlags = this_00->implicitCallFlags | IVar1;
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetMethodPropertyScoped(unaligned T *playout)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        Var varInstance = GetReg(playout->Instance);
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);

        RecyclableObject* obj = NULL;
        if (VarIs<RecyclableObject>(varInstance))
        {
            obj = VarTo<RecyclableObject>(varInstance);
        }

        InlineCache *inlineCache = this->GetInlineCache(playout->inlineCacheIndex);

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->inlineCacheIndex, true);
        Var aValue;
        if (obj &&
            CacheOperators::TryGetProperty<true, true, false, false, false, false, true, false, false, false>(
                obj, false, obj, propertyId, &aValue, GetScriptContext(), nullptr, &info))
        {
            threadContext->CheckAndResetImplicitCallAccessorFlag();
            threadContext->AddImplicitCallFlags(savedImplicitCallFlags);

            SetReg(playout->Value, aValue);
            return;
        }

        OP_GetMethodPropertyScoped_NoFastPath(playout);

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
    }